

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

void __thiscall
LASquadtree::get_cell_bounding_box(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  float fVar1;
  float fVar2;
  float local_50;
  float local_4c;
  float cell_max_y;
  float cell_min_y;
  float cell_max_x;
  float cell_min_x;
  float cell_mid_y;
  float cell_mid_x;
  F32 *max_local;
  F32 *min_local;
  U32 level_local;
  F64 y_local;
  F64 x_local;
  LASquadtree *this_local;
  
  cell_min_y = (float)this->min_x;
  cell_max_y = (float)this->max_x;
  local_4c = (float)this->min_y;
  local_50 = (float)this->max_y;
  for (min_local._4_4_ = level; min_local._4_4_ != 0; min_local._4_4_ = min_local._4_4_ - 1) {
    fVar1 = (cell_min_y + cell_max_y) / 2.0;
    fVar2 = (local_4c + local_50) / 2.0;
    if ((double)x < (double)fVar1) {
      cell_max_y = fVar1;
      fVar1 = cell_min_y;
    }
    cell_min_y = fVar1;
    if ((double)y < (double)fVar2) {
      local_50 = fVar2;
      fVar2 = local_4c;
    }
    local_4c = fVar2;
  }
  if (min != (F32 *)0x0) {
    *min = (F32)cell_min_y;
    min[1] = (F32)local_4c;
  }
  if (max != (F32 *)0x0) {
    *max = (F32)cell_max_y;
    max[1] = (F32)local_50;
  }
  return;
}

Assistant:

void LASquadtree::get_cell_bounding_box(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  while (level)
  {
    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;
    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
}